

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelctemp.cpp
# Opt level: O2

void __thiscall
TPZIntelGen<pzshape::TPZShapeQuad>::Write
          (TPZIntelGen<pzshape::TPZShapeQuad> *this,TPZStream *buf,int withclassid)

{
  int classid;
  TPZManVector<int,_3> order;
  
  TPZInterpolatedElement::Write(&this->super_TPZInterpolatedElement,buf,withclassid);
  classid = 0;
  TPZManVector<int,_3>::TPZManVector(&order,3,&classid);
  TPZIntQuad::GetOrder(&this->fIntRule,&order.super_TPZVec<int>);
  TPZStream::Write<int>(buf,&order.super_TPZVec<int>);
  (*buf->_vptr_TPZStream[3])
            (buf,&(this->super_TPZInterpolatedElement).super_TPZInterpolationSpace.fPreferredOrder,1
            );
  classid = (**(code **)(*(long *)&(this->super_TPZInterpolatedElement).super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x20))(this);
  (*buf->_vptr_TPZStream[3])(buf,&classid,1);
  TPZManVector<int,_3>::~TPZManVector(&order);
  return;
}

Assistant:

void TPZIntelGen<TSHAPE>::Write(TPZStream &buf, int withclassid) const
{
	TPZInterpolatedElement::Write(buf,withclassid);
	TPZManVector<int,3> order(3,0);
	fIntRule.GetOrder(order);
	buf.Write(order);
	buf.Write(&fPreferredOrder,1);
	int classid = this->ClassId();
	buf.Write ( &classid, 1 );
}